

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  secp256k1_context *psVar7;
  secp256k1_keypair **ppsVar8;
  uchar **ppuVar9;
  uchar **ppuVar10;
  uchar **ppuVar11;
  uchar *puVar12;
  uchar *puVar13;
  secp256k1_keypair *psVar14;
  uchar *puVar15;
  size_t __size;
  ulong uVar16;
  char *pcVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  char **ppcVar21;
  undefined8 uStackY_290;
  int in_stack_fffffffffffffd78;
  bench_schnorrsig_data data_1;
  uchar sk [32];
  bench_data data;
  secp256k1_ecdsa_signature sig;
  secp256k1_pubkey pubkey;
  undefined8 local_98 [13];
  
  pcVar4 = getenv("SECP256K1_BENCH_ITERS");
  if (pcVar4 == (char *)0x0) {
    uVar5 = 20000;
  }
  else {
    uVar5 = strtol(pcVar4,(char **)0x0,0);
  }
  ppcVar21 = argv;
  while (ppcVar21 = ppcVar21 + 1, ppcVar21 != argv + argc) {
    pcVar4 = *ppcVar21;
    lVar20 = 0;
    do {
      if (lVar20 == 0xa8) goto LAB_00102aef;
      iVar1 = strcmp(pcVar4,*(char **)((long)&PTR_anon_var_dwarf_d5_00106d20 + lVar20));
      lVar20 = lVar20 + 8;
    } while (iVar1 != 0);
  }
LAB_00102aef:
  if (1 < argc) {
    iVar1 = argc;
    iVar2 = have_flag(argc,argv,"-h");
    if (((iVar2 != 0) || (iVar1 = argc, iVar2 = have_flag(argc,argv,"--help"), iVar2 != 0)) ||
       (iVar1 = argc, iVar2 = have_flag(argc,argv,"help"), iVar2 != 0)) {
      help(iVar1);
      return 0;
    }
    if (ppcVar21 != argv + argc) {
      iVar1 = 0x1040e7;
      fwrite("./bench: unrecognized argument.\n\n",0x21,1,_stderr);
      help(iVar1);
      return 1;
    }
  }
  iVar1 = have_flag(argc,argv,"recover");
  if ((iVar1 != 0) || (iVar1 = have_flag(argc,argv,"ecdsa_recover"), iVar1 != 0)) {
    fwrite("./bench: Public key recovery module not enabled.\n",0x31,1,_stderr);
    fwrite("Use ./configure --enable-module-recovery.\n\n",0x2b,1,_stderr);
    return 1;
  }
  data.ctx = (secp256k1_context *)secp256k1_context_create(1);
  for (lVar20 = 8; lVar20 != 0x28; lVar20 = lVar20 + 1) {
    data.msg[lVar20 + -8] = (char)lVar20 + 0xf9;
  }
  for (lVar20 = 0x28; lVar20 != 0x48; lVar20 = lVar20 + 1) {
    data.msg[lVar20 + -8] = (char)lVar20 + 0xf9;
  }
  data.siglen = 0x48;
  uVar18 = 0;
  iVar1 = secp256k1_ecdsa_sign(data.ctx,&sig,data.msg,data.key,0);
  if (iVar1 == 0) {
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c";
    pcVar17 = 
    "test condition failed: secp256k1_ecdsa_sign(data.ctx, &sig, data.msg, data.key, NULL, NULL)";
    uStackY_290 = 0xf9;
LAB_00103292:
    fprintf(_stderr,"%s:%d: %s\n",pcVar4,uStackY_290,pcVar17);
    abort();
  }
  iVar1 = secp256k1_ecdsa_signature_serialize_der(data.ctx,data.sig,&data.siglen,&sig);
  if (iVar1 == 0) {
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c";
    pcVar17 = 
    "test condition failed: secp256k1_ecdsa_signature_serialize_der(data.ctx, data.sig, &data.siglen, &sig)"
    ;
    uStackY_290 = 0xfa;
    goto LAB_00103292;
  }
  iVar1 = secp256k1_ec_pubkey_create(data.ctx,&pubkey,data.key);
  if (iVar1 == 0) {
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c";
    pcVar17 = "test condition failed: secp256k1_ec_pubkey_create(data.ctx, &pubkey, data.key)";
    uStackY_290 = 0xfb;
    goto LAB_00103292;
  }
  data.pubkeylen = 0x21;
  iVar1 = secp256k1_ec_pubkey_serialize(data.ctx,data.pubkey,&data.pubkeylen,&pubkey,0x102);
  if (iVar1 != 1) {
    pcVar4 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/bench.c";
    pcVar17 = 
    "test condition failed: secp256k1_ec_pubkey_serialize(data.ctx, data.pubkey, &data.pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED) == 1"
    ;
    uStackY_290 = 0xfd;
    goto LAB_00103292;
  }
  printf("%-30s,%-15s,%-15s,%-15s\n","Benchmark","    Min(us)    ","    Avg(us)    ",
         "    Max(us)    ");
  putchar(10);
  iVar1 = (int)uVar5;
  if (argc == 1) {
    run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                  (_func_void_void_ptr_int *)&data,(void *)(uVar5 & 0xffffffff),(int)uVar18,
                  in_stack_fffffffffffffd78);
LAB_00102d86:
    run_benchmark("ecdsa_sign",bench_sign_run,bench_sign_setup,(_func_void_void_ptr_int *)&data,
                  (void *)(uVar5 & 0xffffffff),(int)uVar18,in_stack_fffffffffffffd78);
    if (argc != 1) goto LAB_00102db1;
LAB_00102df3:
    run_benchmark("ec_keygen",bench_keygen_run,bench_keygen_setup,(_func_void_void_ptr_int *)&data,
                  (void *)(uVar5 & 0xffffffff),(int)uVar18,in_stack_fffffffffffffd78);
  }
  else {
    iVar2 = have_flag(argc,argv,"ecdsa");
    if (((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"verify"), iVar2 != 0)) ||
       (iVar2 = have_flag(argc,argv,"ecdsa_verify"), iVar2 != 0)) {
      run_benchmark("ecdsa_verify",bench_verify,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr_int *)&data,(void *)(uVar5 & 0xffffffff),(int)uVar18,
                    in_stack_fffffffffffffd78);
    }
    iVar2 = have_flag(argc,argv,"ecdsa");
    if (((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"sign"), iVar2 != 0)) ||
       (iVar2 = have_flag(argc,argv,"ecdsa_sign"), iVar2 != 0)) goto LAB_00102d86;
LAB_00102db1:
    iVar2 = have_flag(argc,argv,"ec");
    if (((iVar2 != 0) || (iVar2 = have_flag(argc,argv,"keygen"), iVar2 != 0)) ||
       (iVar2 = have_flag(argc,argv,"ec_keygen"), iVar2 != 0)) goto LAB_00102df3;
  }
  secp256k1_context_destroy(data.ctx);
  uVar6 = secp256k1_context_create(1);
  local_98[0] = uVar6;
  if ((argc == 1) || (iVar2 = have_flag(argc,argv,"ecdh"), iVar2 != 0)) {
    run_benchmark("ecdh",bench_ecdh,bench_ecdh_setup,(_func_void_void_ptr_int *)local_98,
                  (void *)(uVar5 & 0xffffffff),(int)uVar18,in_stack_fffffffffffffd78);
    uVar6 = local_98[0];
  }
  secp256k1_context_destroy(uVar6);
  psVar7 = (secp256k1_context *)secp256k1_context_create(1);
  __size = (long)iVar1 << 3;
  data_1.ctx = psVar7;
  ppsVar8 = (secp256k1_keypair **)malloc(__size);
  data_1.keypairs = ppsVar8;
  ppuVar9 = (uchar **)malloc(__size);
  data_1.pk = ppuVar9;
  ppuVar10 = (uchar **)malloc(__size);
  data_1.msgs = ppuVar10;
  ppuVar11 = (uchar **)malloc(__size);
  uVar16 = 0;
  uVar19 = 0;
  data_1.sigs = ppuVar11;
  if (0 < iVar1) {
    uVar19 = uVar5 & 0xffffffff;
  }
  for (; iVar2 = (int)uVar18, uVar19 != uVar16; uVar16 = uVar16 + 1) {
    puVar12 = (uchar *)malloc(0x20);
    puVar13 = (uchar *)malloc(0x40);
    psVar14 = (secp256k1_keypair *)malloc(0x60);
    puVar15 = (uchar *)malloc(0x20);
    sk[0] = (uchar)uVar16;
    *puVar12 = sk[0];
    sk[1] = (uchar)(uVar16 >> 8);
    puVar12[1] = sk[1];
    sk[2] = (uchar)(uVar16 >> 0x10);
    puVar12[2] = sk[2];
    sk[3] = (uchar)(uVar16 >> 0x18);
    puVar12[3] = sk[3];
    puVar12[4] = 'm';
    puVar12[5] = 'm';
    puVar12[6] = 'm';
    puVar12[7] = 'm';
    puVar12[8] = 'm';
    puVar12[9] = 'm';
    puVar12[10] = 'm';
    puVar12[0xb] = 'm';
    puVar12[0xc] = 'm';
    puVar12[0xd] = 'm';
    puVar12[0xe] = 'm';
    puVar12[0xf] = 'm';
    puVar12[0x10] = 'm';
    puVar12[0x11] = 'm';
    puVar12[0x12] = 'm';
    puVar12[0x13] = 'm';
    puVar12[0x10] = 'm';
    puVar12[0x11] = 'm';
    puVar12[0x12] = 'm';
    puVar12[0x13] = 'm';
    puVar12[0x14] = 'm';
    puVar12[0x15] = 'm';
    puVar12[0x16] = 'm';
    puVar12[0x17] = 'm';
    puVar12[0x18] = 'm';
    puVar12[0x19] = 'm';
    puVar12[0x1a] = 'm';
    puVar12[0x1b] = 'm';
    puVar12[0x1c] = 'm';
    puVar12[0x1d] = 'm';
    puVar12[0x1e] = 'm';
    puVar12[0x1f] = 'm';
    builtin_memcpy(sk + 0x14,"ssssssssssss",0xc);
    builtin_memcpy(sk + 4,"ssssssssssssssss",0x10);
    ppsVar8[uVar16] = psVar14;
    ppuVar9[uVar16] = puVar15;
    ppuVar10[uVar16] = puVar12;
    ppuVar11[uVar16] = puVar13;
    iVar2 = secp256k1_keypair_create(psVar7,psVar14,sk);
    if (iVar2 == 0) {
      pcVar17 = "test condition failed: secp256k1_keypair_create(data.ctx, keypair, sk)";
      uStackY_290 = 0x4f;
LAB_00103291:
      pcVar4 = 
      "/workspace/llm4binary/github/license_all_cmakelists_25/fanquake[P]secp256k1/src/modules/schnorrsig/bench_impl.h"
      ;
      goto LAB_00103292;
    }
    uVar18 = 0;
    iVar2 = secp256k1_schnorrsig_sign_custom(psVar7,puVar13,puVar12,0x20,psVar14);
    if (iVar2 == 0) {
      pcVar17 = 
      "test condition failed: secp256k1_schnorrsig_sign_custom(data.ctx, sig, msg, MSGLEN, keypair, NULL)"
      ;
      uStackY_290 = 0x50;
      goto LAB_00103291;
    }
    iVar2 = secp256k1_keypair_xonly_pub(psVar7,local_98,0,psVar14);
    if (iVar2 == 0) {
      pcVar17 = "test condition failed: secp256k1_keypair_xonly_pub(data.ctx, &pk, NULL, keypair)";
      uStackY_290 = 0x51;
      goto LAB_00103291;
    }
    iVar2 = secp256k1_xonly_pubkey_serialize(psVar7,puVar15,local_98);
    if (iVar2 != 1) {
      pcVar17 = 
      "test condition failed: secp256k1_xonly_pubkey_serialize(data.ctx, pk_char, &pk) == 1";
      uStackY_290 = 0x52;
      goto LAB_00103291;
    }
  }
  if (argc == 1) {
    run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                  (_func_void_void_ptr_int *)&data_1,(void *)(uVar5 & 0xffffffff),iVar2,
                  in_stack_fffffffffffffd78);
  }
  else {
    iVar3 = have_flag(argc,argv,"schnorrsig");
    if (((iVar3 != 0) || (iVar3 = have_flag(argc,argv,"sign"), iVar3 != 0)) ||
       (iVar3 = have_flag(argc,argv,"schnorrsig_sign"), iVar3 != 0)) {
      run_benchmark("schnorrsig_sign",bench_schnorrsig_sign,(_func_void_void_ptr *)0x0,
                    (_func_void_void_ptr_int *)&data_1,(void *)(uVar5 & 0xffffffff),iVar2,
                    in_stack_fffffffffffffd78);
    }
    iVar3 = have_flag(argc,argv,"schnorrsig");
    if (((iVar3 == 0) && (iVar3 = have_flag(argc,argv,"verify"), iVar3 == 0)) &&
       (iVar3 = have_flag(argc,argv,"schnorrsig_verify"), iVar3 == 0)) goto LAB_0010313c;
  }
  run_benchmark("schnorrsig_verify",bench_schnorrsig_verify,(_func_void_void_ptr *)0x0,
                (_func_void_void_ptr_int *)&data_1,(void *)(uVar5 & 0xffffffff),iVar2,
                in_stack_fffffffffffffd78);
LAB_0010313c:
  for (uVar5 = 0; uVar19 != uVar5; uVar5 = uVar5 + 1) {
    free(data_1.keypairs[uVar5]);
    free(data_1.pk[uVar5]);
    free(data_1.msgs[uVar5]);
    free(data_1.sigs[uVar5]);
  }
  free(data_1.keypairs);
  free(data_1.pk);
  free(data_1.msgs);
  free(data_1.sigs);
  secp256k1_context_destroy(data_1.ctx);
  run_ellswift_bench(iVar1,argc,argv);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    int i;
    secp256k1_pubkey pubkey;
    secp256k1_ecdsa_signature sig;
    bench_data data;

    int d = argc == 1;
    int default_iters = 20000;
    int iters = get_iters(default_iters);

    /* Check for invalid user arguments */
    char* valid_args[] = {"ecdsa", "verify", "ecdsa_verify", "sign", "ecdsa_sign", "ecdh", "recover",
                         "ecdsa_recover", "schnorrsig", "schnorrsig_verify", "schnorrsig_sign", "ec",
                         "keygen", "ec_keygen", "ellswift", "encode", "ellswift_encode", "decode",
                         "ellswift_decode", "ellswift_keygen", "ellswift_ecdh"};
    size_t valid_args_size = sizeof(valid_args)/sizeof(valid_args[0]);
    int invalid_args = have_invalid_args(argc, argv, valid_args, valid_args_size);

    if (argc > 1) {
        if (have_flag(argc, argv, "-h")
           || have_flag(argc, argv, "--help")
           || have_flag(argc, argv, "help")) {
            help(default_iters);
            return EXIT_SUCCESS;
        } else if (invalid_args) {
            fprintf(stderr, "./bench: unrecognized argument.\n\n");
            help(default_iters);
            return EXIT_FAILURE;
        }
    }

/* Check if the user tries to benchmark optional module without building it */
#ifndef ENABLE_MODULE_ECDH
    if (have_flag(argc, argv, "ecdh")) {
        fprintf(stderr, "./bench: ECDH module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ecdh.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_RECOVERY
    if (have_flag(argc, argv, "recover") || have_flag(argc, argv, "ecdsa_recover")) {
        fprintf(stderr, "./bench: Public key recovery module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-recovery.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_SCHNORRSIG
    if (have_flag(argc, argv, "schnorrsig") || have_flag(argc, argv, "schnorrsig_sign") || have_flag(argc, argv, "schnorrsig_verify")) {
        fprintf(stderr, "./bench: Schnorr signatures module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-schnorrsig.\n\n");
        return EXIT_FAILURE;
    }
#endif

#ifndef ENABLE_MODULE_ELLSWIFT
    if (have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ellswift_encode") || have_flag(argc, argv, "ellswift_decode") ||
        have_flag(argc, argv, "encode") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_keygen") ||
        have_flag(argc, argv, "ellswift_ecdh")) {
        fprintf(stderr, "./bench: ElligatorSwift module not enabled.\n");
        fprintf(stderr, "Use ./configure --enable-module-ellswift.\n\n");
        return EXIT_FAILURE;
    }
#endif

    /* ECDSA benchmark */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    for (i = 0; i < 32; i++) {
        data.msg[i] = 1 + i;
    }
    for (i = 0; i < 32; i++) {
        data.key[i] = 33 + i;
    }
    data.siglen = 72;
    CHECK(secp256k1_ecdsa_sign(data.ctx, &sig, data.msg, data.key, NULL, NULL));
    CHECK(secp256k1_ecdsa_signature_serialize_der(data.ctx, data.sig, &data.siglen, &sig));
    CHECK(secp256k1_ec_pubkey_create(data.ctx, &pubkey, data.key));
    data.pubkeylen = 33;
    CHECK(secp256k1_ec_pubkey_serialize(data.ctx, data.pubkey, &data.pubkeylen, &pubkey, SECP256K1_EC_COMPRESSED) == 1);

    print_output_table_header_row();
    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "verify") || have_flag(argc, argv, "ecdsa_verify")) run_benchmark("ecdsa_verify", bench_verify, NULL, NULL, &data, 10, iters);

    if (d || have_flag(argc, argv, "ecdsa") || have_flag(argc, argv, "sign") || have_flag(argc, argv, "ecdsa_sign")) run_benchmark("ecdsa_sign", bench_sign_run, bench_sign_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ec") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ec_keygen")) run_benchmark("ec_keygen", bench_keygen_run, bench_keygen_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);

#ifdef ENABLE_MODULE_ECDH
    /* ECDH benchmarks */
    run_ecdh_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_RECOVERY
    /* ECDSA recovery benchmarks */
    run_recovery_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_SCHNORRSIG
    /* Schnorr signature benchmarks */
    run_schnorrsig_bench(iters, argc, argv);
#endif

#ifdef ENABLE_MODULE_ELLSWIFT
    /* ElligatorSwift benchmarks */
    run_ellswift_bench(iters, argc, argv);
#endif

    return EXIT_SUCCESS;
}